

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O1

BamIndex *
BamTools::Internal::BamIndexFactory::CreateIndexFromFilename
          (string *indexFilename,BamReaderPrivate *reader)

{
  int iVar1;
  BamToolsIndex *this;
  bool bVar2;
  string extension;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  string local_38;
  
  FileExtension(&local_38,indexFilename);
  if (local_38._M_string_length != 0) {
    BamStandardIndex::Extension_abi_cxx11_();
    if (local_38._M_string_length == local_50) {
      if (local_38._M_string_length == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38._M_dataplus._M_p,local_58,local_38._M_string_length);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    if (bVar2) {
      this = (BamToolsIndex *)operator_new(0x68);
      BamStandardIndex::BamStandardIndex((BamStandardIndex *)this,reader);
      goto LAB_001a5db8;
    }
    BamToolsIndex::Extension_abi_cxx11_();
    if (local_38._M_string_length == local_50) {
      if (local_38._M_string_length == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38._M_dataplus._M_p,local_58,local_38._M_string_length);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    if (bVar2) {
      this = (BamToolsIndex *)operator_new(0x68);
      BamToolsIndex::BamToolsIndex(this,reader);
      goto LAB_001a5db8;
    }
  }
  this = (BamToolsIndex *)0x0;
LAB_001a5db8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return &this->super_BamIndex;
}

Assistant:

BamIndex* BamIndexFactory::CreateIndexFromFilename(const std::string& indexFilename,
                                                   BamReaderPrivate* reader)
{

    // get file extension from index filename, including dot (".EXT")
    // if can't get file extension, return null index
    const std::string extension = FileExtension(indexFilename);
    if (extension.empty()) return 0;

    // create index based on extension
    if (extension == BamStandardIndex::Extension())
        return new BamStandardIndex(reader);
    else if (extension == BamToolsIndex::Extension())
        return new BamToolsIndex(reader);
    else
        return 0;
}